

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

ParameterizedTestSuiteInfo<FastPForLib::FastPForTest> * __thiscall
testing::internal::ParameterizedTestSuiteRegistry::
GetTestSuitePatternHolder<FastPForLib::FastPForTest>
          (ParameterizedTestSuiteRegistry *this,string *test_suite_name,CodeLocation *code_location)

{
  bool bVar1;
  int iVar2;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
  code_location_00;
  pointer ppVar3;
  reference ppPVar4;
  undefined4 extraout_var;
  string *psVar5;
  ParameterizedTestSuiteInfo<FastPForLib::FastPForTest> *code_location_01;
  ParameterizedTestSuiteInfo<FastPForLib::FastPForTest> *in_RSI;
  vector<testing::internal::ParameterizedTestSuiteInfoBase_*,_std::allocator<testing::internal::ParameterizedTestSuiteInfoBase_*>_>
  *in_RDI;
  ParameterizedTestSuiteInfoBase *test_suite_info;
  iterator item_it;
  ParameterizedTestSuiteInfo<FastPForLib::FastPForTest> *typed_test_info;
  CodeLocation *in_stack_ffffffffffffff08;
  CodeLocation *in_stack_ffffffffffffff10;
  vector<testing::internal::ParameterizedTestSuiteInfoBase_*,_std::allocator<testing::internal::ParameterizedTestSuiteInfoBase_*>_>
  *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args;
  string *in_stack_ffffffffffffff28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_58 [32];
  value_type local_38;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
  local_30;
  ParameterizedTestSuiteInfo<FastPForLib::FastPForTest> *test_suite_name_00;
  
  test_suite_name_00 = (ParameterizedTestSuiteInfo<FastPForLib::FastPForTest> *)0x0;
  code_location_00._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
       ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
               *)in_stack_ffffffffffffff08,(key_type *)0x12dd0b);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
       ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
              *)in_stack_ffffffffffffff08);
  bVar1 = std::__detail::operator!=
                    ((_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                      *)&stack0xffffffffffffffd8,&local_30);
  if (bVar1) {
    ppVar3 = std::__detail::
             _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_false,_true>
                           *)0x12dd51);
    ppPVar4 = std::
              vector<testing::internal::ParameterizedTestSuiteInfoBase_*,_std::allocator<testing::internal::ParameterizedTestSuiteInfoBase_*>_>
              ::operator[](in_RDI,ppVar3->second);
    local_38 = *ppPVar4;
    iVar2 = (*local_38->_vptr_ParameterizedTestSuiteInfoBase[3])();
    in_stack_ffffffffffffff28 = (string *)CONCAT44(extraout_var,iVar2);
    psVar5 = (string *)GetTypeId<FastPForLib::FastPForTest>();
    if (in_stack_ffffffffffffff28 != psVar5) {
      std::__cxx11::string::c_str();
      ReportInvalidTestSuiteType((char *)test_suite_name_00,(CodeLocation *)code_location_00._M_cur)
      ;
      posix::Abort();
    }
    test_suite_name_00 =
         CheckedDowncastToActualType<testing::internal::ParameterizedTestSuiteInfo<FastPForLib::FastPForTest>,testing::internal::ParameterizedTestSuiteInfoBase>
                   (&in_RSI->super_ParameterizedTestSuiteInfoBase);
  }
  if (test_suite_name_00 == (ParameterizedTestSuiteInfo<FastPForLib::FastPForTest> *)0x0) {
    code_location_01 = (ParameterizedTestSuiteInfo<FastPForLib::FastPForTest> *)operator_new(0x80);
    std::__cxx11::string::string(local_58,(string *)in_RSI);
    __args = &local_90;
    CodeLocation::CodeLocation(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    ParameterizedTestSuiteInfo<FastPForLib::FastPForTest>::ParameterizedTestSuiteInfo
              (in_RSI,in_stack_ffffffffffffff28,(CodeLocation *)code_location_01);
    test_suite_name_00 = code_location_01;
    CodeLocation::~CodeLocation((CodeLocation *)0x12de42);
    std::__cxx11::string::~string(local_58);
    this_00 = in_RDI + 1;
    std::
    vector<testing::internal::ParameterizedTestSuiteInfoBase_*,_std::allocator<testing::internal::ParameterizedTestSuiteInfoBase_*>_>
    ::size(in_RDI);
    std::
    unordered_map<std::__cxx11::string,unsigned_long,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
    ::emplace<std::__cxx11::string,unsigned_long>
              ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                *)code_location_01,__args,(unsigned_long *)this_00);
    std::
    vector<testing::internal::ParameterizedTestSuiteInfoBase_*,_std::allocator<testing::internal::ParameterizedTestSuiteInfoBase_*>_>
    ::push_back(this_00,(value_type *)in_stack_ffffffffffffff08);
  }
  return test_suite_name_00;
}

Assistant:

ParameterizedTestSuiteInfo<TestSuite>* GetTestSuitePatternHolder(
      std::string test_suite_name, CodeLocation code_location) {
    ParameterizedTestSuiteInfo<TestSuite>* typed_test_info = nullptr;

    auto item_it = suite_name_to_info_index_.find(test_suite_name);
    if (item_it != suite_name_to_info_index_.end()) {
      auto* test_suite_info = test_suite_infos_[item_it->second];
      if (test_suite_info->GetTestSuiteTypeId() != GetTypeId<TestSuite>()) {
        // Complain about incorrect usage of Google Test facilities
        // and terminate the program since we cannot guaranty correct
        // test suite setup and tear-down in this case.
        ReportInvalidTestSuiteType(test_suite_name.c_str(), code_location);
        posix::Abort();
      } else {
        // At this point we are sure that the object we found is of the same
        // type we are looking for, so we downcast it to that type
        // without further checks.
        typed_test_info =
            CheckedDowncastToActualType<ParameterizedTestSuiteInfo<TestSuite>>(
                test_suite_info);
      }
    }
    if (typed_test_info == nullptr) {
      typed_test_info = new ParameterizedTestSuiteInfo<TestSuite>(
          test_suite_name, std::move(code_location));
      suite_name_to_info_index_.emplace(std::move(test_suite_name),
                                        test_suite_infos_.size());
      test_suite_infos_.push_back(typed_test_info);
    }
    return typed_test_info;
  }